

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O0

bool __thiscall spvtools::opt::LoopFusion::CheckStep(LoopFusion *this)

{
  bool bVar1;
  int iVar2;
  ScalarEvolutionAnalysis *this_00;
  SENode *pSVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SENode *pSVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  SENode *induction_step_1;
  SENode *induction_node_1;
  SENode *induction_step_0;
  SENode *induction_node_0;
  ScalarEvolutionAnalysis *scalar_analysis;
  LoopFusion *this_local;
  
  this_00 = IRContext::GetScalarEvolutionAnalysis(this->context_);
  pSVar3 = ScalarEvolutionAnalysis::AnalyzeInstruction(this_00,this->induction_0_);
  pSVar3 = ScalarEvolutionAnalysis::SimplifyExpression(this_00,pSVar3);
  iVar2 = (*pSVar3->_vptr_SENode[6])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    this_local._7_1_ = false;
  }
  else {
    iVar2 = (*pSVar3->_vptr_SENode[6])();
    pSVar3 = SERecurrentNode::GetCoefficient((SERecurrentNode *)CONCAT44(extraout_var_00,iVar2));
    iVar2 = (*pSVar3->_vptr_SENode[4])();
    if (CONCAT44(extraout_var_01,iVar2) == 0) {
      this_local._7_1_ = false;
    }
    else {
      pSVar4 = ScalarEvolutionAnalysis::AnalyzeInstruction(this_00,this->induction_1_);
      pSVar4 = ScalarEvolutionAnalysis::SimplifyExpression(this_00,pSVar4);
      iVar2 = (*pSVar4->_vptr_SENode[6])();
      if (CONCAT44(extraout_var_02,iVar2) == 0) {
        this_local._7_1_ = false;
      }
      else {
        iVar2 = (*pSVar4->_vptr_SENode[6])();
        pSVar4 = SERecurrentNode::GetCoefficient((SERecurrentNode *)CONCAT44(extraout_var_03,iVar2))
        ;
        iVar2 = (*pSVar4->_vptr_SENode[4])();
        if (CONCAT44(extraout_var_04,iVar2) == 0) {
          this_local._7_1_ = false;
        }
        else {
          bVar1 = SENode::operator!=(pSVar3,pSVar4);
          if (bVar1) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool LoopFusion::CheckStep() {
  auto scalar_analysis = context_->GetScalarEvolutionAnalysis();
  SENode* induction_node_0 = scalar_analysis->SimplifyExpression(
      scalar_analysis->AnalyzeInstruction(induction_0_));
  if (!induction_node_0->AsSERecurrentNode()) {
    return false;
  }

  SENode* induction_step_0 =
      induction_node_0->AsSERecurrentNode()->GetCoefficient();
  if (!induction_step_0->AsSEConstantNode()) {
    return false;
  }

  SENode* induction_node_1 = scalar_analysis->SimplifyExpression(
      scalar_analysis->AnalyzeInstruction(induction_1_));
  if (!induction_node_1->AsSERecurrentNode()) {
    return false;
  }

  SENode* induction_step_1 =
      induction_node_1->AsSERecurrentNode()->GetCoefficient();
  if (!induction_step_1->AsSEConstantNode()) {
    return false;
  }

  if (*induction_step_0 != *induction_step_1) {
    return false;
  }

  return true;
}